

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_akey.cc
# Opt level: O0

void * v2i_AUTHORITY_KEYID(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *values)

{
  X509 *x;
  int iVar1;
  CONF_VALUE *pCVar2;
  AUTHORITY_KEYID *pAVar3;
  X509_EXTENSION *ext_00;
  X509_NAME *xn;
  ASN1_INTEGER *x_00;
  GENERAL_NAME *p;
  size_t sVar4;
  X509_EXTENSION *ext;
  CONF_VALUE *cnf;
  size_t i;
  AUTHORITY_KEYID *akeyid;
  X509 *cert;
  ASN1_INTEGER *serial;
  GENERAL_NAME *gen;
  GENERAL_NAMES *gens;
  X509_NAME *isname;
  ASN1_OCTET_STRING *ikeyid;
  int j;
  char issuer;
  char keyid;
  stack_st_CONF_VALUE *values_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  ikeyid._7_1_ = '\0';
  ikeyid._6_1_ = '\0';
  isname = (X509_NAME *)0x0;
  gens = (GENERAL_NAMES *)0x0;
  gen = (GENERAL_NAME *)0x0;
  cert = (X509 *)0x0;
  for (cnf = (CONF_VALUE *)0x0; pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(values), cnf < pCVar2;
      cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
    pCVar2 = sk_CONF_VALUE_value(values,(size_t)cnf);
    iVar1 = strcmp(pCVar2->name,"keyid");
    if (iVar1 == 0) {
      ikeyid._7_1_ = '\x01';
      if ((pCVar2->value != (char *)0x0) && (iVar1 = strcmp(pCVar2->value,"always"), iVar1 == 0)) {
        ikeyid._7_1_ = '\x02';
      }
    }
    else {
      iVar1 = strcmp(pCVar2->name,"issuer");
      if (iVar1 != 0) {
        ERR_put_error(0x14,0,0x9f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_akey.cc"
                      ,0x78);
        ERR_add_error_data(2,"name=",pCVar2->name);
        return (void *)0x0;
      }
      ikeyid._6_1_ = '\x01';
      if ((pCVar2->value != (char *)0x0) && (iVar1 = strcmp(pCVar2->value,"always"), iVar1 == 0)) {
        ikeyid._6_1_ = '\x02';
      }
    }
  }
  if ((ctx == (X509V3_CTX *)0x0) || (ctx->issuer_cert == (X509 *)0x0)) {
    if ((ctx != (X509V3_CTX *)0x0) && (ctx->flags == 1)) {
      pAVar3 = AUTHORITY_KEYID_new();
      return pAVar3;
    }
    ERR_put_error(0x14,0,0x8c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_akey.cc"
                  ,0x82);
    return (void *)0x0;
  }
  x = (X509 *)ctx->issuer_cert;
  if (ikeyid._7_1_ != '\0') {
    iVar1 = X509_get_ext_by_NID(x,0x52,-1);
    if ((-1 < iVar1) && (ext_00 = X509_get_ext(x,iVar1), ext_00 != (X509_EXTENSION *)0x0)) {
      isname = (X509_NAME *)X509V3_EXT_d2i(ext_00);
    }
    if ((ikeyid._7_1_ == '\x02') && (isname == (X509_NAME *)0x0)) {
      ERR_put_error(0x14,0,0x9b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_akey.cc"
                    ,0x8f);
      return (void *)0x0;
    }
  }
  if (((ikeyid._6_1_ != '\0') && (isname == (X509_NAME *)0x0)) || (ikeyid._6_1_ == '\x02')) {
    xn = X509_get_issuer_name(x);
    gens = (GENERAL_NAMES *)X509_NAME_dup(xn);
    x_00 = X509_get0_serialNumber((X509 *)x);
    cert = (X509 *)ASN1_INTEGER_dup((ASN1_INTEGER *)x_00);
    if (((X509_NAME *)gens == (X509_NAME *)0x0) || (cert == (X509 *)0x0)) {
      ERR_put_error(0x14,0,0x9a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_akey.cc"
                    ,0x98);
      goto LAB_00303117;
    }
  }
  pAVar3 = AUTHORITY_KEYID_new();
  if (pAVar3 == (AUTHORITY_KEYID *)0x0) {
LAB_00303117:
    X509_NAME_free((X509_NAME *)gens);
    ASN1_INTEGER_free((ASN1_INTEGER *)cert);
    ASN1_OCTET_STRING_free((ASN1_OCTET_STRING *)isname);
    return (void *)0x0;
  }
  if (gens != (GENERAL_NAMES *)0x0) {
    gen = (GENERAL_NAME *)sk_GENERAL_NAME_new_null();
    if (((gen == (GENERAL_NAME *)0x0) || (p = GENERAL_NAME_new(), p == (GENERAL_NAME *)0x0)) ||
       (sVar4 = sk_GENERAL_NAME_push((stack_st_GENERAL_NAME *)gen,(GENERAL_NAME *)p), sVar4 == 0))
    goto LAB_00303117;
    p->type = 4;
    (p->d).otherName = (OTHERNAME *)gens;
  }
  pAVar3->issuer = (GENERAL_NAMES *)gen;
  pAVar3->serial = (ASN1_INTEGER *)cert;
  pAVar3->keyid = (ASN1_OCTET_STRING *)isname;
  return pAVar3;
}

Assistant:

static void *v2i_AUTHORITY_KEYID(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *values) {
  char keyid = 0, issuer = 0;
  int j;
  ASN1_OCTET_STRING *ikeyid = NULL;
  X509_NAME *isname = NULL;
  GENERAL_NAMES *gens = NULL;
  GENERAL_NAME *gen = NULL;
  ASN1_INTEGER *serial = NULL;
  const X509 *cert;
  AUTHORITY_KEYID *akeyid;

  for (size_t i = 0; i < sk_CONF_VALUE_num(values); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(values, i);
    if (!strcmp(cnf->name, "keyid")) {
      keyid = 1;
      if (cnf->value && !strcmp(cnf->value, "always")) {
        keyid = 2;
      }
    } else if (!strcmp(cnf->name, "issuer")) {
      issuer = 1;
      if (cnf->value && !strcmp(cnf->value, "always")) {
        issuer = 2;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_OPTION);
      ERR_add_error_data(2, "name=", cnf->name);
      return NULL;
    }
  }

  if (!ctx || !ctx->issuer_cert) {
    if (ctx && (ctx->flags == X509V3_CTX_TEST)) {
      return AUTHORITY_KEYID_new();
    }
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_ISSUER_CERTIFICATE);
    return NULL;
  }

  cert = ctx->issuer_cert;

  if (keyid) {
    j = X509_get_ext_by_NID(cert, NID_subject_key_identifier, -1);
    const X509_EXTENSION *ext;
    if ((j >= 0) && (ext = X509_get_ext(cert, j))) {
      ikeyid = reinterpret_cast<ASN1_OCTET_STRING *>(X509V3_EXT_d2i(ext));
    }
    if (keyid == 2 && !ikeyid) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNABLE_TO_GET_ISSUER_KEYID);
      return NULL;
    }
  }

  if ((issuer && !ikeyid) || (issuer == 2)) {
    isname = X509_NAME_dup(X509_get_issuer_name(cert));
    serial = ASN1_INTEGER_dup(X509_get0_serialNumber(cert));
    if (!isname || !serial) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNABLE_TO_GET_ISSUER_DETAILS);
      goto err;
    }
  }

  if (!(akeyid = AUTHORITY_KEYID_new())) {
    goto err;
  }

  if (isname) {
    if (!(gens = sk_GENERAL_NAME_new_null()) || !(gen = GENERAL_NAME_new()) ||
        !sk_GENERAL_NAME_push(gens, gen)) {
      goto err;
    }
    gen->type = GEN_DIRNAME;
    gen->d.dirn = isname;
  }

  akeyid->issuer = gens;
  akeyid->serial = serial;
  akeyid->keyid = ikeyid;

  return akeyid;

err:
  X509_NAME_free(isname);
  ASN1_INTEGER_free(serial);
  ASN1_OCTET_STRING_free(ikeyid);
  return NULL;
}